

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_reference_unittest.cpp
# Opt level: O0

void __thiscall ArrayReference_metafunctions_Test::TestBody(ArrayReference_metafunctions_Test *this)

{
  bool bVar1;
  char *message;
  size_type local_d0 [2];
  ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_c0;
  undefined1 local_a8 [8];
  by_view vv1;
  size_type local_88;
  undefined1 local_80 [8];
  by_reference vr1;
  Message local_60;
  int local_58 [4];
  size_type local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  by_value v1;
  ArrayReference_metafunctions_Test *this_local;
  
  memory::
  Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::Array<int,void>((Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
                     *)&gtest_ar.message_,10);
  local_48 = memory::
             ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::size((ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                     *)&gtest_ar.message_);
  local_58[0] = 10;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_40,"v1.size()","10",&local_48,local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &vr1.
                super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                .size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
               ,0x48,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &vr1.
                super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                .size_,&local_60);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &vr1.
                super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                .size_);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_88 = 0;
  vv1.size_ = 5;
  memory::
  ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()((array_reference_type *)local_80,
               (ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&gtest_ar.message_,&local_88,&vv1.size_);
  local_d0[1] = 0;
  local_d0[0] = 5;
  memory::
  ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::operator()((array_reference_type *)&local_c0,
               (ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                *)&gtest_ar.message_,local_d0 + 1,local_d0);
  local_a8 = (undefined1  [8])local_c0._0_8_;
  vv1._0_8_ = local_c0.pointer_;
  vv1.pointer_ = (pointer)local_c0.size_;
  memory::
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference((ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                     *)&local_c0);
  memory::
  ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayViewImpl((ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                    *)local_a8);
  memory::
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayReference((ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                     *)local_80);
  memory::
  Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~Array((Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
            *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ArrayReference, metafunctions) {
    using namespace memory;

    using by_value = Array<double, HostCoordinator<double>>;
    using by_view  = ArrayView<double, HostCoordinator<double>>;
    using by_reference = typename by_view::array_reference_type;

    // create range by value of length 10
    // this should allocate memory of length 10*sizeof(T)
    by_value v1(10);
    EXPECT_EQ(v1.size(), 10);

    by_reference vr1 = v1(0,5);
    by_view      vv1 = v1(0,5);

    // test that array_reference correctly detects an arary_reference
    static_assert(impl::is_array_reference<decltype(vr1)>::value,
                  "is_array_reference did not correctly classify array reference");
    static_assert(impl::is_array_reference<decltype(v1(all))>::value,
                  "is_array_reference did not correctly classify array reference");
    static_assert(impl::is_array_reference<decltype(v1(0,1))>::value,
                  "is_array_reference did not correctly classify array reference");

    // check that is_array_reference is false for an array_view
    static_assert(impl::is_array_reference<decltype(vv1)>::value==false,
                  "is_array_reference identified an array_view as an array_reference");

    // check that is_array_view returns true for ArrayReferences
    // this is desireable because is_array_view is designed for use in template
    // specializations, for which it is required that the argument foo(v(0,1))
    // should be treated as an ArrayView
    static_assert(impl::is_array_view<decltype(vr1)>::value,
                  "is_array_view did not correctly classify array reference");
    static_assert(impl::is_array_view<decltype(v1(all))>::value,
                  "is_array_view did not correctly classify array reference");
    static_assert(impl::is_array_view<decltype(v1(0,1))>::value,
                  "is_array_view did not correctly classify array reference");

}